

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined4 uVar8;
  undefined4 uVar12;
  float *pfVar9;
  int *piVar10;
  Allocator *pAVar11;
  int iVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  bool bVar16;
  uint _h;
  int iVar17;
  int iVar18;
  int k;
  int iVar19;
  undefined8 in_RCX;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  short *psVar24;
  ulong uVar25;
  undefined1 *puVar26;
  long lVar27;
  int k_1;
  uint uVar28;
  size_t sVar29;
  int kk;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  void *pvVar33;
  void *pvVar34;
  int i;
  long lVar35;
  undefined1 *puVar36;
  long lVar37;
  long lVar38;
  undefined1 *puVar39;
  uint uVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  short *psVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  int iVar48;
  undefined1 auVar49 [16];
  float fVar50;
  int TILE_N;
  int TILE_K;
  Mat m;
  int TILE_K_1;
  int TILE_M;
  long local_240;
  long local_238;
  uint local_224;
  ulong local_220;
  short *local_218;
  int local_20c;
  undefined1 local_208 [40];
  undefined1 local_1e0 [16];
  int local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  long local_1b0;
  Mat local_1a8;
  long local_158;
  short *local_150;
  long local_148;
  uint local_13c;
  long local_138;
  Mat *local_130;
  ulong local_128;
  undefined8 local_120;
  Mat local_118;
  Option *local_c8;
  undefined8 local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  uint local_8c;
  int local_88;
  int local_84;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  k = (int)in_RCX;
  uVar8 = (this->super_Convolution).kernel_w;
  uVar12 = (this->super_Convolution).kernel_h;
  uVar47 = uVar12 * uVar8;
  uVar22 = (ulong)uVar47;
  uVar46 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar47;
  uVar40 = (this->super_Convolution).num_output;
  local_98 = (long)(int)uVar40;
  local_1b8 = (ulong)uVar40;
  uVar46 = (long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff) /
           (long)(int)uVar40;
  _h = (uint)uVar46;
  uVar30 = uVar46 & 0xffffffff;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar16 = false;
  }
  else {
    k = (int)CONCAT71((int7)((ulong)in_RCX >> 8),8 < (int)_h);
    bVar16 = 8 < (int)uVar40 || 8 < (int)_h;
  }
  auVar49._0_4_ = -(uint)(uVar8 == 3);
  auVar49._4_4_ = -(uint)(uVar12 == 3);
  auVar49._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar49._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar19 = movmskps(k,auVar49);
  local_130 = &(this->super_Convolution).weight_data;
  local_c8 = opt;
  if ((((iVar19 == 0xf) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar16)))) {
    if (opt->use_winograd43_convolution == true) {
      get_optimal_tile_mnk_int8
                (uVar40,0,_h,(int *)&local_224,&local_20c,(int *)&local_13c,opt->num_threads);
      uVar47 = local_13c;
      iVar19 = (int)((uVar40 - 1) + local_224) / (int)local_224;
      iVar48 = local_224 * local_13c;
      local_1a8.cstep = 0;
      local_1a8.data = (void *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.allocator = (Allocator *)0x0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
      Mat::create(&local_1a8,iVar48 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      Mat::create(&this->weight_winograd43_data,iVar48,0x24,(int)(_h + uVar47 + -1) / (int)uVar47,
                  iVar19,4,(Allocator *)0x0);
      if (0 < iVar19) {
        local_1c0 = CONCAT44(local_1c0._4_4_,_h * 9);
        local_220 = (ulong)(int)_h;
        iVar48 = 0;
        local_1b0 = CONCAT44(local_1b0._4_4_,iVar19);
        do {
          iVar19 = local_224 * iVar48;
          iVar17 = get_omp_thread_num();
          local_158 = CONCAT44(local_158._4_4_,iVar48);
          uVar46 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
          local_208._0_8_ = (long)iVar17 * local_1a8.cstep * uVar46 + (long)local_1a8.data;
          local_208._8_4_ = 0;
          local_208._12_4_ = 0;
          local_208._16_4_ = (undefined4)local_1a8.elemsize;
          local_208._20_4_ = local_1a8.elemsize._4_4_;
          local_208._24_4_ = local_1a8.elempack;
          local_208._32_8_ = local_1a8.allocator;
          auVar14._4_8_ = local_1e0._8_8_;
          auVar14._0_4_ = local_1a8.w;
          local_1e0._0_8_ = auVar14._0_8_ << 0x20;
          local_1e0._8_4_ = local_1a8.h;
          local_1e0._12_4_ = 1;
          local_1d0 = local_1a8.d;
          local_1e0._0_4_ = local_1a8.dims + -1;
          local_1c8 = (uVar46 * (long)local_1a8.h * (long)local_1a8.w + 0xf & 0xfffffffffffffff0) /
                      uVar46;
          if (local_1a8.dims == 4) {
            local_1c8 = (long)local_1a8.h * (long)local_1a8.w;
          }
          if (0 < (int)_h) {
            uVar40 = (int)local_1b8 - iVar19;
            if ((int)local_224 < (int)uVar40) {
              uVar40 = local_224;
            }
            local_148 = (long)(int)local_13c;
            local_150 = (short *)(long)(iVar19 / (int)local_224);
            uVar46 = 0;
            lVar35 = local_148;
            local_218 = (short *)local_208._0_8_;
            do {
              lVar27 = local_148;
              uVar47 = _h - (int)uVar46;
              if ((int)(uint)lVar35 < (int)uVar47) {
                uVar47 = (uint)lVar35;
              }
              if (0 < (int)uVar40) {
                pvVar33 = local_130->data;
                uVar22 = 0;
                psVar44 = local_218;
                do {
                  if (0 < (int)uVar47) {
                    uVar30 = 0;
                    do {
                      pcVar32 = (char *)((long)pvVar33 +
                                        (uVar30 + uVar46) * 9 +
                                        (long)((iVar19 + (int)uVar22) * (int)local_1c0));
                      lVar35 = 0;
                      do {
                        cVar2 = *pcVar32;
                        cVar3 = pcVar32[1];
                        cVar4 = pcVar32[2];
                        *(short *)((long)&local_118.data + lVar35 * 2) = cVar2 * 6;
                        *(short *)((long)&local_118.data + lVar35 * 2 + 6) =
                             -(cVar4 * 4 + cVar3 * 4 + cVar2 * 4);
                        *(short *)((long)&local_118.refcount + lVar35 * 2 + 4) =
                             cVar3 * 4 + cVar2 * -4 + cVar4 * -4;
                        *(short *)((long)&local_118.elemsize + lVar35 * 2 + 2) =
                             (short)cVar2 + cVar3 * 2 + cVar4 * 4;
                        *(short *)((long)&local_118.elempack + lVar35 * 2) =
                             ((short)cVar2 - ((short)cVar3 + (short)cVar3)) + cVar4 * 4;
                        *(short *)(&local_118.field_0x1e + lVar35 * 2) = cVar4 * 6;
                        pcVar32 = pcVar32 + 3;
                        lVar35 = lVar35 + 1;
                      } while (lVar35 != 3);
                      lVar35 = 4;
                      do {
                        sVar5 = *(short *)((long)&local_120 + lVar35 + 4);
                        sVar6 = *(short *)((long)&local_120 + lVar35 + 6);
                        sVar7 = *(short *)((long)&local_118.data + lVar35);
                        *psVar44 = sVar5 * 6;
                        psVar44[1] = -(sVar7 * 4 + sVar6 * 4 + sVar5 * 4);
                        psVar44[2] = sVar6 * 4 + sVar5 * -4 + sVar7 * -4;
                        psVar44[3] = sVar5 + sVar6 * 2 + sVar7 * 4;
                        psVar44[4] = sVar5 + sVar6 * -2 + sVar7 * 4;
                        psVar44[5] = sVar7 * 6;
                        psVar44 = psVar44 + 6;
                        lVar35 = lVar35 + 6;
                      } while (lVar35 != 0x28);
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar47);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar40);
              }
              local_118.w = (this->weight_winograd43_data).w;
              sVar29 = (this->weight_winograd43_data).elemsize;
              local_118.h = (this->weight_winograd43_data).h;
              local_118.elempack = (this->weight_winograd43_data).elempack;
              local_118.allocator = (this->weight_winograd43_data).allocator;
              local_118.cstep = (long)local_118.h * (long)local_118.w;
              local_118.data =
                   (void *)((long)(this->weight_winograd43_data).data +
                           sVar29 * local_118.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 |
                                             uVar46 & 0xffffffff) / (long)(int)local_148) +
                           (this->weight_winograd43_data).cstep * (long)local_150 * sVar29);
              local_118.refcount._0_4_ = 0;
              local_118.refcount._4_4_ = 0;
              local_118.elemsize._0_4_ = (undefined4)sVar29;
              local_118.elemsize._4_4_ = (undefined4)(sVar29 >> 0x20);
              local_118.dims = 2;
              local_118.d = 1;
              local_118.c = 1;
              pack_A_tile_int8((Mat *)local_208,&local_118,0x24,uVar40,uVar47);
              local_118.cstep = 0;
              local_118.data = (void *)0x0;
              local_118.refcount._0_4_ = 0;
              local_118.refcount._4_4_ = 0;
              local_118.elemsize._0_4_ = 0;
              local_118.elemsize._4_4_ = 0;
              local_118.elempack = 0;
              local_118.dims = 0;
              local_118.w = 0;
              local_118.h = 0;
              local_118.d = 0;
              local_118.c = 0;
              uVar46 = uVar46 + lVar27;
              lVar35 = lVar27;
            } while ((long)uVar46 < (long)local_220);
          }
          piVar10 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
          iVar19 = (int)local_1b0;
          iVar48 = (int)local_158;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
                if ((short *)local_208._0_8_ != (short *)0x0) {
                  free((void *)local_208._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_208._32_8_)[3])();
              }
            }
          }
          local_1c8 = 0;
          local_208._0_8_ = (void *)0x0;
          local_208._8_4_ = 0;
          local_208._12_4_ = 0;
          local_208._16_4_ = 0;
          local_208._20_4_ = 0;
          local_208._24_4_ = 0;
          local_1e0 = ZEXT816(0);
          local_1d0 = 0;
          iVar48 = iVar48 + 1;
        } while (iVar48 != iVar19);
      }
      piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1a8.allocator != (Allocator *)0x0) {
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
            goto LAB_00152ff3;
          }
LAB_00152fe6:
          if (local_1a8.data != (void *)0x0) {
            free(local_1a8.data);
          }
        }
      }
    }
    else {
      get_optimal_tile_mnk_int8
                (uVar40,0,_h,(int *)&local_224,&local_20c,(int *)&local_13c,opt->num_threads);
      uVar47 = local_13c;
      iVar48 = (int)((uVar40 - 1) + local_224) / (int)local_224;
      iVar19 = local_224 * local_13c;
      local_1a8.cstep = 0;
      local_1a8.data = (void *)0x0;
      local_1a8.refcount._0_4_ = 0;
      local_1a8.refcount._4_4_ = 0;
      local_1a8.elemsize._0_4_ = 0;
      local_1a8.elemsize._4_4_ = 0;
      local_1a8.elempack = 0;
      local_1a8.allocator = (Allocator *)0x0;
      local_1a8.dims = 0;
      local_1a8.w = 0;
      local_1a8.h = 0;
      local_1a8.d = 0;
      local_1a8.c = 0;
      Mat::create(&local_1a8,iVar19 * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      Mat::create(&this->weight_winograd23_data,iVar19,0x10,(int)(_h + uVar47 + -1) / (int)uVar47,
                  iVar48,2,(Allocator *)0x0);
      if (0 < iVar48) {
        local_148 = (long)(int)_h;
        iVar19 = 0;
        local_218 = (short *)CONCAT44(local_218._4_4_,iVar48);
        do {
          iVar48 = local_224 * iVar19;
          iVar17 = get_omp_thread_num();
          uVar40 = local_13c;
          local_220 = CONCAT44(local_220._4_4_,iVar19);
          uVar46 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
          local_208._0_8_ = (long)iVar17 * local_1a8.cstep * uVar46 + (long)local_1a8.data;
          local_208._8_4_ = 0;
          local_208._12_4_ = 0;
          local_208._16_4_ = (undefined4)local_1a8.elemsize;
          local_208._20_4_ = local_1a8.elemsize._4_4_;
          local_208._24_4_ = local_1a8.elempack;
          local_208._32_8_ = local_1a8.allocator;
          auVar15._4_8_ = local_1e0._8_8_;
          auVar15._0_4_ = local_1a8.w;
          local_1e0._0_8_ = auVar15._0_8_ << 0x20;
          local_1e0._8_4_ = local_1a8.h;
          local_1e0._12_4_ = 1;
          local_1d0 = local_1a8.d;
          local_1e0._0_4_ = local_1a8.dims + -1;
          local_1c8 = (uVar46 * (long)local_1a8.h * (long)local_1a8.w + 0xf & 0xfffffffffffffff0) /
                      uVar46;
          if (local_1a8.dims == 4) {
            local_1c8 = (long)local_1a8.h * (long)local_1a8.w;
          }
          if (0 < (int)_h) {
            uVar47 = (int)local_98 - iVar48;
            if ((int)local_224 < (int)uVar47) {
              uVar47 = local_224;
            }
            lVar35 = (long)(int)local_13c;
            local_1c0 = (ulong)(iVar48 / (int)local_224);
            uVar46 = 0;
            local_150 = (short *)local_208._0_8_;
            do {
              uVar28 = _h - (int)uVar46;
              if ((int)uVar40 < (int)uVar28) {
                uVar28 = uVar40;
              }
              if (0 < (int)uVar47) {
                pvVar33 = local_130->data;
                uVar22 = 0;
                psVar44 = local_150;
                do {
                  if (0 < (int)uVar28) {
                    uVar30 = 0;
                    do {
                      pcVar32 = (char *)((long)pvVar33 +
                                        (uVar30 + uVar46) * 9 +
                                        (long)(int)((iVar48 + (int)uVar22) * _h * 9));
                      lVar27 = 0;
                      do {
                        cVar2 = *pcVar32;
                        cVar3 = pcVar32[1];
                        cVar4 = pcVar32[2];
                        *(short *)((long)&local_118.data + lVar27 * 2) = cVar2 * 2;
                        *(short *)((long)&local_118.data + lVar27 * 2 + 6) =
                             (short)cVar2 + (short)cVar3 + (short)cVar4;
                        *(short *)((long)&local_118.refcount + lVar27 * 2 + 4) =
                             ((short)cVar2 - (short)cVar3) + (short)cVar4;
                        *(short *)((long)&local_118.elemsize + lVar27 * 2 + 2) =
                             (short)cVar4 + (short)cVar4;
                        pcVar32 = pcVar32 + 3;
                        lVar27 = lVar27 + 1;
                      } while (lVar27 != 3);
                      lVar27 = 4;
                      do {
                        sVar5 = *(short *)((long)&local_120 + lVar27 + 4);
                        sVar6 = *(short *)((long)&local_120 + lVar27 + 6);
                        sVar7 = *(short *)((long)&local_118.data + lVar27);
                        *psVar44 = sVar5 * 2;
                        psVar44[1] = sVar6 + sVar5 + sVar7;
                        psVar44[2] = (sVar5 - sVar6) + sVar7;
                        psVar44[3] = sVar7 * 2;
                        psVar44 = psVar44 + 4;
                        lVar27 = lVar27 + 6;
                      } while (lVar27 != 0x1c);
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar28);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar47);
              }
              local_118.w = (this->weight_winograd23_data).w;
              sVar29 = (this->weight_winograd23_data).elemsize;
              local_118.h = (this->weight_winograd23_data).h;
              local_118.elempack = (this->weight_winograd23_data).elempack;
              local_118.allocator = (this->weight_winograd23_data).allocator;
              local_118.cstep = (long)local_118.h * (long)local_118.w;
              local_118.data =
                   (void *)((long)(this->weight_winograd23_data).data +
                           sVar29 * local_118.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 |
                                             uVar46 & 0xffffffff) / (long)(int)uVar40) +
                           (this->weight_winograd23_data).cstep * local_1c0 * sVar29);
              local_118.refcount._0_4_ = 0;
              local_118.refcount._4_4_ = 0;
              local_118.elemsize._0_4_ = (undefined4)sVar29;
              local_118.elemsize._4_4_ = (undefined4)(sVar29 >> 0x20);
              local_118.dims = 2;
              local_118.d = 1;
              local_118.c = 1;
              pack_A_tile_int8((Mat *)local_208,&local_118,0x10,uVar47,uVar28);
              local_118.cstep = 0;
              local_118.data = (void *)0x0;
              local_118.refcount._0_4_ = 0;
              local_118.refcount._4_4_ = 0;
              local_118.elemsize._0_4_ = 0;
              local_118.elemsize._4_4_ = 0;
              local_118.elempack = 0;
              local_118.dims = 0;
              local_118.w = 0;
              local_118.h = 0;
              local_118.d = 0;
              local_118.c = 0;
              uVar46 = uVar46 + lVar35;
            } while ((long)uVar46 < local_148);
          }
          piVar10 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
          iVar48 = (int)local_218;
          iVar19 = (uint)local_220;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
                if ((short *)local_208._0_8_ != (short *)0x0) {
                  free((void *)local_208._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_208._32_8_)[3])();
              }
            }
          }
          local_1c8 = 0;
          local_208._0_8_ = (void *)0x0;
          local_208._8_4_ = 0;
          local_208._12_4_ = 0;
          local_208._16_4_ = 0;
          local_208._20_4_ = 0;
          local_208._24_4_ = 0;
          local_1e0 = ZEXT816(0);
          local_1d0 = 0;
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar48);
      }
      piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) goto LAB_00152fe6;
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_220 = uVar22;
    if (opt->use_sgemm_convolution != true) {
      uVar28 = _h;
      if ((int)uVar40 < 4) {
        if ((int)uVar40 < 2) {
          uVar42 = uVar40;
          if (7 < (int)_h) {
            uVar28 = (_h & 1) + (int)(uVar30 >> 3) + ((uint)(uVar30 >> 1) & 3);
            goto LAB_00152077;
          }
          if (1 < (int)_h) {
            uVar28 = _h - ((uint)(uVar46 >> 1) & 0x7fffffff);
            goto LAB_0015211a;
          }
          sVar29 = 1;
          iVar19 = 1;
        }
        else if ((int)_h < 8) {
          if (1 < (int)_h) {
            uVar28 = _h - (int)(uVar30 >> 1);
            uVar42 = (uVar40 & 1) + 1;
            goto LAB_001520d1;
          }
          uVar42 = (uVar40 & 1) + 1;
LAB_0015211a:
          sVar29 = 2;
          iVar19 = 2;
        }
        else {
          sVar29 = 0x10;
          iVar19 = 0x10;
          uVar28 = (_h & 1) + (int)(uVar30 >> 3) + ((uint)(uVar30 >> 1) & 3);
          uVar42 = (uVar40 & 1) + 1;
        }
      }
      else if ((int)_h < 8) {
        if ((int)_h < 2) {
          uVar42 = (uVar40 & 1) + (uVar40 >> 2) + (uint)((uVar40 >> 1 & 1) != 0);
LAB_001520d1:
          sVar29 = 4;
          iVar19 = 4;
        }
        else {
          uVar28 = _h - ((uint)(uVar46 >> 1) & 0x7fffffff);
          uVar42 = (uVar40 & 1) + (uVar40 >> 2) + (uint)((uVar40 >> 1 & 1) != 0);
LAB_00152077:
          sVar29 = 8;
          iVar19 = 8;
        }
      }
      else {
        sVar29 = 0x20;
        iVar19 = 0x20;
        uVar28 = (_h & 1) + ((uint)(uVar46 >> 3) & 0x1fffffff) + ((uint)(uVar46 >> 1) & 3);
        uVar42 = (uVar40 & 1) + (uVar40 >> 2) + (uint)((uVar40 >> 1 & 1) != 0);
      }
      Mat::create(&this->weight_data_tm,uVar47,uVar28,uVar42,sVar29,iVar19,(Allocator *)0x0);
      uVar30 = 0;
      local_138 = (long)(int)uVar47;
      if (3 < (int)uVar40) {
        iVar18 = _h * uVar47;
        lVar35 = (long)(int)(uVar47 * 2);
        local_158 = (long)(int)(uVar47 * 8);
        local_c0 = CONCAT44(local_c0._4_4_,_h) & 0xfffffffffffffff8;
        iVar17 = _h * uVar47;
        iVar19 = iVar17 * 4;
        local_b8 = CONCAT44(local_b8._4_4_,iVar19);
        iVar48 = iVar17 * 3;
        iVar17 = iVar17 * 2;
        local_b0 = CONCAT44(local_b0._4_4_,iVar18);
        uVar25 = 0;
        uVar30 = 0;
        uVar21 = uVar22;
        iVar43 = iVar18;
        do {
          local_a8 = uVar30;
          local_128 = uVar25;
          pvVar33 = (this->super_Convolution).weight_data.data;
          uVar40 = (uint)local_a8;
          local_238 = (long)(int)(iVar18 * uVar40) + (long)pvVar33;
          local_240 = (long)(int)((uVar40 | 1) * iVar18) + (long)pvVar33;
          psVar44 = (short *)((long)(int)((uVar40 | 2) * iVar18) + (long)pvVar33);
          uVar30 = (long)(int)((uVar40 | 3) * iVar18) + (long)pvVar33;
          puVar36 = (undefined1 *)
                    ((local_a8 >> 2) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_1b0 = CONCAT44(local_1b0._4_4_,iVar48);
          local_120 = CONCAT44(local_120._4_4_,iVar17);
          local_a0 = CONCAT44(local_a0._4_4_,iVar43);
          iVar23 = (int)local_128;
          if ((int)_h < 8) {
            uVar25 = 0;
          }
          else {
            lVar27 = 0;
            psVar24 = (short *)0x0;
            local_218 = psVar44;
            do {
              if (0 < (int)(uint)local_220) {
                uVar25 = 0;
                lVar31 = lVar27;
                do {
                  puVar39 = puVar36;
                  lVar20 = 0;
                  lVar37 = lVar31;
                  do {
                    puVar39[lVar20] = *(undefined1 *)((long)pvVar33 + lVar37 + iVar23);
                    puVar39[lVar20 + 1] =
                         *(undefined1 *)((long)pvVar33 + lVar37 + iVar23 + local_138);
                    puVar39[lVar20 + 2] = *(undefined1 *)((long)pvVar33 + lVar37 + iVar43);
                    puVar39[lVar20 + 3] =
                         *(undefined1 *)((long)pvVar33 + lVar37 + iVar43 + local_138);
                    puVar39[lVar20 + 4] = *(undefined1 *)((long)pvVar33 + lVar37 + iVar17);
                    puVar39[lVar20 + 5] =
                         *(undefined1 *)((long)pvVar33 + lVar37 + iVar17 + local_138);
                    puVar39[lVar20 + 6] = *(undefined1 *)((long)pvVar33 + lVar37 + iVar48);
                    puVar39[lVar20 + 7] =
                         *(undefined1 *)((long)pvVar33 + lVar37 + iVar48 + local_138);
                    lVar20 = lVar20 + 8;
                    lVar37 = lVar37 + lVar35;
                  } while ((int)lVar20 != 0x20);
                  uVar25 = uVar25 + 1;
                  lVar31 = lVar31 + 1;
                  puVar36 = puVar39 + lVar20;
                } while (uVar25 != uVar22);
                puVar36 = puVar39 + lVar20;
                local_1c0 = uVar30;
                local_150 = psVar24;
                local_148 = lVar27;
              }
              local_238 = local_238 + local_158;
              local_240 = local_240 + local_158;
              psVar44 = (short *)((long)local_218 + local_158);
              uVar30 = uVar30 + local_158;
              iVar13 = (int)psVar24;
              lVar27 = lVar27 + local_158;
              psVar24 = (short *)(ulong)(iVar13 + 8);
              local_218 = psVar44;
            } while (iVar13 + 0xf < (int)_h);
            uVar25 = uVar46 & 0xfffffff8;
            uVar21 = local_220;
          }
          uVar40 = (uint)uVar25;
          if ((int)(uVar40 | 1) < (int)_h) {
            lVar27 = uVar30 + local_138;
            lVar31 = local_138 + (long)psVar44;
            lVar37 = local_240 + local_138;
            lVar20 = local_238 + local_138;
            do {
              if (0 < (int)uVar21) {
                uVar21 = 0;
                puVar39 = puVar36;
                do {
                  puVar26 = puVar39;
                  puVar39 = puVar36 + uVar21 * 8;
                  *puVar39 = *(undefined1 *)(local_238 + uVar21);
                  puVar39[1] = *(undefined1 *)(lVar20 + uVar21);
                  puVar39[2] = *(undefined1 *)(local_240 + uVar21);
                  puVar39[3] = *(undefined1 *)(lVar37 + uVar21);
                  puVar39[4] = *(undefined1 *)((long)psVar44 + uVar21);
                  puVar39[5] = *(undefined1 *)(lVar31 + uVar21);
                  puVar39[6] = *(undefined1 *)(uVar30 + uVar21);
                  puVar39[7] = *(undefined1 *)(lVar27 + uVar21);
                  uVar21 = uVar21 + 1;
                  puVar39 = puVar39 + 8;
                } while (uVar22 != uVar21);
                puVar36 = puVar26 + 8;
                uVar21 = local_220;
                local_1c0 = uVar25;
              }
              local_238 = local_238 + lVar35;
              local_240 = local_240 + lVar35;
              psVar44 = (short *)((long)psVar44 + lVar35);
              uVar30 = uVar30 + lVar35;
              iVar13 = (int)uVar25;
              uVar40 = iVar13 + 2;
              lVar27 = lVar27 + lVar35;
              lVar31 = lVar31 + lVar35;
              lVar37 = lVar37 + lVar35;
              lVar20 = lVar20 + lVar35;
              uVar25 = (ulong)uVar40;
            } while (iVar13 + 3 < (int)_h);
          }
          uVar47 = (uint)uVar21;
          if ((int)uVar40 < (int)_h) {
            do {
              if (0 < (int)uVar47) {
                uVar25 = 0;
                do {
                  *puVar36 = *(undefined1 *)(local_238 + uVar25);
                  puVar36[1] = *(undefined1 *)(local_240 + uVar25);
                  puVar36[2] = *(undefined1 *)((long)psVar44 + uVar25);
                  puVar36[3] = *(undefined1 *)(uVar30 + uVar25);
                  puVar36 = puVar36 + 4;
                  uVar25 = uVar25 + 1;
                } while (uVar22 != uVar25);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != _h);
          }
          uVar30 = local_a8 + 4;
          iVar43 = iVar43 + iVar19;
          iVar17 = iVar17 + iVar19;
          iVar48 = iVar48 + iVar19;
          uVar25 = (ulong)(uint)(iVar23 + iVar19);
        } while (local_a8 + 7 < local_1b8);
      }
      uVar28 = (uint)uVar30;
      uVar40 = uVar28 | 1;
      if ((int)uVar40 < (int)local_98) {
        uVar42 = _h * uVar47;
        local_50 = (ulong)uVar42;
        local_80 = (long)(int)(uVar47 * 2);
        local_58 = (long)(int)(uVar47 * 3);
        local_60 = (long)(int)(uVar47 * 4);
        local_68 = (long)(int)(uVar47 * 5);
        local_70 = (long)(int)(uVar47 * 6);
        local_38 = (long)(int)(uVar47 * 8);
        local_78 = (long)(int)(uVar47 * 7);
        local_8c = _h & 0xfffffff8;
        local_88 = uVar42 * 2;
        uVar28 = uVar28 * uVar42;
        uVar46 = uVar30 & 0xffffffff;
        iVar19 = uVar42 * uVar40;
        do {
          local_84 = iVar19;
          local_40 = uVar46;
          pvVar33 = (this->super_Convolution).weight_data.data;
          psVar44 = (short *)((long)(int)(uVar42 * (uint)local_40) + (long)pvVar33);
          lVar35 = (long)(int)(uVar40 * uVar42) + (long)pvVar33;
          puVar36 = (undefined1 *)
                    ((ulong)(((uint)(local_40 >> 2) & 0x3fffffff) +
                            (uint)(((uint)local_40 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          if ((int)_h < 8) {
            uVar40 = 0;
          }
          else {
            lVar20 = (long)local_84;
            lVar41 = (long)(int)uVar28;
            local_1b0 = (long)pvVar33 + lVar20 + local_78;
            lVar27 = (long)pvVar33 + lVar20 + local_70;
            local_120 = (long)pvVar33 + lVar20 + local_58;
            local_128 = (long)pvVar33 + lVar20 + local_80;
            lVar45 = (long)pvVar33 + lVar20 + local_138;
            lVar38 = (long)pvVar33 + lVar41 + local_78;
            local_150 = (short *)((long)pvVar33 + lVar41 + local_138);
            uVar46 = (long)pvVar33 + lVar41 + local_70;
            uVar30 = (long)pvVar33 + lVar20 + local_68;
            lVar31 = (long)pvVar33 + lVar41 + local_60;
            lVar37 = (long)pvVar33 + lVar41 + local_58;
            uVar25 = (long)pvVar33 + lVar20 + local_60;
            lVar20 = (long)pvVar33 + lVar41 + local_80;
            lVar41 = (long)pvVar33 + lVar41 + local_68;
            local_218 = psVar44;
            local_158 = lVar35;
            iVar19 = 0;
            do {
              local_148 = lVar41;
              local_a0 = lVar20;
              local_a8 = uVar25;
              local_b0 = lVar37;
              local_b8 = lVar31;
              local_c0 = uVar30;
              local_1c0 = uVar46;
              if (0 < (int)(uint)local_220) {
                uVar46 = 0;
                do {
                  *puVar36 = *(undefined1 *)((long)local_218 + uVar46);
                  puVar36[1] = *(undefined1 *)((long)local_150 + uVar46);
                  puVar36[2] = *(undefined1 *)(local_a0 + uVar46);
                  puVar36[3] = *(undefined1 *)(local_b0 + uVar46);
                  puVar36[4] = *(undefined1 *)(local_b8 + uVar46);
                  puVar36[5] = *(undefined1 *)(local_148 + uVar46);
                  puVar36[6] = *(undefined1 *)(local_1c0 + uVar46);
                  puVar36[7] = *(undefined1 *)(lVar38 + uVar46);
                  puVar36[8] = *(undefined1 *)(local_158 + uVar46);
                  puVar36[9] = *(undefined1 *)(lVar45 + uVar46);
                  puVar36[10] = *(undefined1 *)(local_128 + uVar46);
                  puVar36[0xb] = *(undefined1 *)(local_120 + uVar46);
                  puVar36[0xc] = *(undefined1 *)(local_a8 + uVar46);
                  puVar36[0xd] = *(undefined1 *)(local_c0 + uVar46);
                  puVar36[0xe] = *(undefined1 *)(lVar27 + uVar46);
                  puVar36[0xf] = *(undefined1 *)(local_1b0 + uVar46);
                  puVar36 = puVar36 + 0x10;
                  uVar46 = uVar46 + 1;
                } while (uVar22 != uVar46);
              }
              psVar44 = (short *)((long)local_218 + local_38);
              lVar35 = local_158 + local_38;
              iVar48 = iVar19 + 0xf;
              local_1b0 = local_1b0 + local_38;
              lVar27 = lVar27 + local_38;
              local_120 = local_120 + local_38;
              local_128 = local_128 + local_38;
              lVar45 = lVar45 + local_38;
              lVar38 = lVar38 + local_38;
              local_150 = (short *)((long)local_150 + local_38);
              uVar46 = local_1c0 + local_38;
              uVar30 = local_c0 + local_38;
              lVar31 = local_b8 + local_38;
              lVar37 = local_b0 + local_38;
              uVar25 = local_a8 + local_38;
              lVar20 = local_a0 + local_38;
              lVar41 = local_148 + local_38;
              uVar40 = local_8c;
              local_218 = psVar44;
              local_158 = lVar35;
              local_48 = (ulong)uVar28;
              iVar19 = iVar19 + 8;
            } while (iVar48 < (int)_h);
          }
          if ((int)(uVar40 | 1) < (int)_h) {
            lVar27 = lVar35 + local_138;
            lVar31 = (long)psVar44 + local_138;
            uVar47 = uVar40;
            do {
              if (0 < (int)(uint)local_220) {
                uVar46 = 0;
                do {
                  *puVar36 = *(undefined1 *)((long)psVar44 + uVar46);
                  puVar36[1] = *(undefined1 *)(lVar35 + uVar46);
                  puVar36[2] = *(undefined1 *)(lVar31 + uVar46);
                  puVar36[3] = *(undefined1 *)(lVar27 + uVar46);
                  puVar36 = puVar36 + 4;
                  uVar46 = uVar46 + 1;
                } while (uVar22 != uVar46);
              }
              psVar44 = (short *)((long)psVar44 + local_80);
              lVar35 = lVar35 + local_80;
              uVar40 = uVar47 + 2;
              iVar19 = uVar47 + 3;
              lVar27 = lVar27 + local_80;
              lVar31 = lVar31 + local_80;
              uVar47 = uVar40;
            } while (iVar19 < (int)_h);
          }
          if ((int)uVar40 < (int)_h) {
            do {
              if (0 < (int)(uint)local_220) {
                uVar46 = 0;
                do {
                  *puVar36 = *(undefined1 *)((long)psVar44 + uVar46);
                  puVar36[1] = *(undefined1 *)(lVar35 + uVar46);
                  puVar36 = puVar36 + 2;
                  uVar46 = uVar46 + 1;
                } while (uVar22 != uVar46);
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != _h);
          }
          uVar40 = (uint)(local_40 + 3);
          uVar28 = uVar28 + local_88;
          uVar46 = local_40 + 2;
          iVar19 = local_84 + local_88;
        } while ((long)(local_40 + 3) < local_98);
        uVar28 = (uint)(local_40 + 2);
        uVar47 = (uint)local_220;
      }
      if ((int)uVar28 < (int)local_1b8) {
        uVar46 = (ulong)uVar28;
        do {
          uVar40 = (uint)uVar46;
          lVar35 = (long)(int)(_h * uVar47 * uVar40) +
                   (long)(this->super_Convolution).weight_data.data;
          puVar36 = (undefined1 *)
                    ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                     (ulong)((uVar40 & 1) + ((uint)(uVar46 >> 2) & 0x3fffffff) +
                            (uint)((uVar40 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          uVar28 = 0;
          uVar40 = 0;
          if (7 < (int)_h) {
            do {
              if (0 < (int)uVar47) {
                uVar30 = 0;
                do {
                  puVar39 = puVar36;
                  puVar36 = (undefined1 *)(lVar35 + uVar30);
                  lVar27 = 0;
                  do {
                    puVar39[lVar27] = *puVar36;
                    puVar36 = puVar36 + local_138;
                    lVar27 = lVar27 + 1;
                  } while ((int)lVar27 != 8);
                  uVar30 = uVar30 + 1;
                  puVar36 = puVar39 + lVar27;
                } while (uVar30 != uVar22);
                puVar36 = puVar39 + lVar27;
              }
              lVar35 = lVar35 + (int)(uVar47 * 8);
              iVar19 = uVar28 + 0xf;
              uVar28 = uVar28 + 8;
              uVar40 = _h & 0xfffffff8;
            } while (iVar19 < (int)_h);
          }
          if ((int)(uVar40 | 1) < (int)_h) {
            lVar27 = lVar35 + local_138;
            uVar28 = uVar40;
            do {
              if (0 < (int)uVar47) {
                uVar30 = 0;
                do {
                  *puVar36 = *(undefined1 *)(lVar35 + uVar30);
                  puVar36[1] = *(undefined1 *)(lVar27 + uVar30);
                  puVar36 = puVar36 + 2;
                  uVar30 = uVar30 + 1;
                } while (uVar22 != uVar30);
              }
              lVar35 = lVar35 + (int)(uVar47 * 2);
              uVar40 = uVar28 + 2;
              iVar19 = uVar28 + 3;
              lVar27 = lVar27 + (int)(uVar47 * 2);
              uVar28 = uVar40;
            } while (iVar19 < (int)_h);
          }
          if ((int)uVar40 < (int)_h) {
            do {
              if (0 < (int)uVar47) {
                uVar30 = 0;
                do {
                  puVar36[uVar30] = *(undefined1 *)(lVar35 + uVar30);
                  uVar30 = uVar30 + 1;
                } while (uVar22 != uVar30);
                puVar36 = puVar36 + uVar30;
              }
              uVar40 = uVar40 + 1;
            } while (uVar40 != _h);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != local_1b8);
      }
      goto LAB_00153024;
    }
    iVar48 = _h * uVar47;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar40,0,iVar48,(int *)&local_118,(int *)&local_224,&local_20c,opt->num_threads);
    iVar19 = (int)((int)local_118.data + uVar40 + -1) / (int)local_118.data;
    uVar28 = 8;
    if (opt->use_packing_layout == false) {
      uVar28 = 1;
    }
    if ((uVar46 & 7) != 0) {
      uVar28 = 1;
    }
    local_1a8.cstep = 0;
    local_1a8.data = (void *)0x0;
    local_1a8.refcount._0_4_ = 0;
    local_1a8.refcount._4_4_ = 0;
    local_1a8.elemsize._0_4_ = 0;
    local_1a8.elemsize._4_4_ = 0;
    local_1a8.elempack = 0;
    local_1a8.allocator = (Allocator *)0x0;
    local_1a8.dims = 0;
    local_1a8.w = 0;
    local_1a8.h = 0;
    local_1a8.d = 0;
    local_1a8.c = 0;
    if (uVar47 == 1) {
      Mat::reshape((Mat *)local_208,local_130,iVar48,uVar40,(Allocator *)0x0);
      piVar10 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      iVar17 = (int)local_1b8;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1a8.allocator == (Allocator *)0x0) {
            if (local_1a8.data != (void *)0x0) {
              free(local_1a8.data);
            }
          }
          else {
            (*(local_1a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      local_1a8.data = (void *)local_208._0_8_;
      local_1a8.refcount._0_4_ = local_208._8_4_;
      local_1a8.refcount._4_4_ = local_208._12_4_;
      local_1a8.elemsize._0_4_ = local_208._16_4_;
      local_1a8.elemsize._4_4_ = local_208._20_4_;
      local_1a8.elempack = local_208._24_4_;
      local_1a8.allocator = (Allocator *)local_208._32_8_;
      local_1a8.dims = local_1e0._0_4_;
      local_1a8.w = local_1e0._4_4_;
      local_1a8.h = local_1e0._8_4_;
      local_1a8.d = local_1e0._12_4_;
      local_1a8.c = local_1d0;
      local_1a8.cstep = local_1c8;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_208._32_8_)[3])();
          }
        }
      }
      local_1c8 = 0;
      local_208._0_8_ = (void *)0x0;
      local_208._8_4_ = 0;
      local_208._12_4_ = 0;
      local_208._16_4_ = 0;
      local_208._20_4_ = 0;
      local_208._24_4_ = 0;
      local_1e0 = (undefined1  [16])0x0;
      local_1d0 = 0;
    }
    else {
      Mat::reshape((Mat *)local_208,local_130,uVar47,_h,uVar40,(Allocator *)0x0);
      Mat::create(&local_1a8,iVar48,uVar40,1,1,(Allocator *)0x0);
      if (0 < (int)uVar40) {
        uVar46 = 0;
        do {
          if ((int)uVar28 <= (int)_h) {
            pvVar33 = (void *)((long)local_1a8.w * uVar46 *
                               CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) +
                              (long)local_1a8.data);
            lVar35 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar22 = 0;
                do {
                  pvVar34 = pvVar33;
                  uVar30 = 0;
                  do {
                    *(undefined1 *)((long)pvVar34 + uVar30) =
                         *(undefined1 *)
                          (local_208._0_8_ +
                          uVar22 + (lVar35 + uVar30) * (long)(int)local_1e0._4_4_ *
                                   CONCAT44(local_208._20_4_,local_208._16_4_) +
                                   local_1c8 * uVar46 * CONCAT44(local_208._20_4_,local_208._16_4_))
                    ;
                    uVar30 = uVar30 + 1;
                  } while (uVar28 != uVar30);
                  uVar22 = uVar22 + 1;
                  pvVar33 = (void *)((long)pvVar34 + uVar30);
                } while (uVar22 != uVar47);
                pvVar33 = (void *)((long)pvVar34 + uVar30);
                uVar22 = local_220;
              }
              lVar35 = lVar35 + (ulong)uVar28;
            } while (lVar35 < (long)((long)(int)_h - (ulong)(uVar28 - 1)));
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != local_1b8);
      }
      piVar10 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
      iVar17 = (int)local_1b8;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
            if ((void *)local_208._0_8_ != (void *)0x0) {
              free((void *)local_208._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_208._32_8_)[3])();
          }
        }
      }
    }
    iVar43 = local_20c;
    if (local_20c < 4) {
LAB_00152dde:
      Mat::create(&this->weight_sgemm_data,(int)local_118.data * iVar43,
                  (iVar48 + iVar43 + -1) / iVar43,
                  (iVar17 + -1 + (int)local_118.data) / (int)local_118.data,1,1,(Allocator *)0x0);
    }
    else {
      iVar18 = cpu_support_x86_avx512_vnni();
      bVar16 = true;
      if (iVar18 == 0) {
        iVar18 = cpu_support_x86_avx_vnni();
        bVar16 = iVar18 != 0;
      }
      iVar18 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar16 & iVar18 == 0)) goto LAB_00152dde;
      iVar18 = 0x40;
      if ((((int)local_118.data < 0x10) && (iVar18 = 0x20, (int)local_118.data < 8)) &&
         (iVar18 = 0x10, (int)local_118.data < 4)) {
        iVar18 = (uint)(1 < (int)local_118.data) * 4 + 4;
      }
      Mat::create(&this->weight_sgemm_data,(iVar18 + iVar43) * (int)local_118.data,
                  (iVar48 + iVar43 + -1) / iVar43,
                  (iVar17 + -1 + (int)local_118.data) / (int)local_118.data,1,1,(Allocator *)0x0);
    }
    if (0 < iVar19) {
      iVar17 = 0;
      do {
        iVar18 = (int)local_118.data * iVar17;
        iVar43 = (int)local_1b8 - iVar18;
        if ((int)local_118.data < iVar43) {
          iVar43 = (int)local_118.data;
        }
        if (0 < iVar48) {
          iVar23 = 0;
          do {
            iVar13 = iVar48 - iVar23;
            if (local_20c < iVar48 - iVar23) {
              iVar13 = local_20c;
            }
            local_1e0._4_4_ = (this->weight_sgemm_data).w;
            local_1c8 = (size_t)(int)local_1e0._4_4_;
            sVar29 = (this->weight_sgemm_data).elemsize;
            local_208._24_4_ = (this->weight_sgemm_data).elempack;
            local_208._32_8_ = (this->weight_sgemm_data).allocator;
            local_208._0_8_ =
                 (long)(this->weight_sgemm_data).data +
                 sVar29 * local_1c8 * (long)(iVar23 / local_20c) +
                 (long)(iVar18 / (int)local_118.data) * (this->weight_sgemm_data).cstep * sVar29;
            local_208._8_4_ = 0;
            local_208._12_4_ = 0;
            local_208._16_4_ = (undefined4)sVar29;
            local_208._20_4_ = (undefined4)(sVar29 >> 0x20);
            local_1e0._0_4_ = 2;
            local_1e0._8_4_ = 1;
            local_1e0._12_4_ = 1;
            local_1d0 = 1;
            Gemm_x86_utility::pack_A_tile_int8
                      (&local_1a8,(Mat *)local_208,iVar18,iVar43,iVar23,iVar13);
            piVar10 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + -1;
              UNLOCK();
              if (*piVar10 == 0) {
                if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
                  if ((void *)local_208._0_8_ != (void *)0x0) {
                    free((void *)local_208._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_208._32_8_)[3])();
                }
              }
            }
            local_1c8 = 0;
            local_208._0_8_ = (void *)0x0;
            local_208._8_4_ = 0;
            local_208._12_4_ = 0;
            local_208._16_4_ = 0;
            local_208._20_4_ = 0;
            local_208._24_4_ = 0;
            local_1e0 = ZEXT816(0);
            local_1d0 = 0;
            iVar23 = iVar23 + local_20c;
          } while (iVar23 < iVar48);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != iVar19);
    }
    piVar10 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) goto LAB_00152fe6;
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00152ff3:
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
LAB_00153024:
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  lVar35 = (long)(this->super_Convolution).num_output;
  if (0 < lVar35) {
    pvVar33 = (this->super_Convolution).weight_data_int8_scales.data;
    pfVar9 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
    pvVar34 = (this->scale_in_data).data;
    lVar27 = 0;
    do {
      fVar1 = *(float *)((long)pvVar33 + lVar27 * 4);
      fVar50 = 0.0;
      if (fVar1 != 0.0) {
        fVar50 = 1.0 / (fVar1 * *pfVar9);
      }
      *(float *)((long)pvVar34 + lVar27 * 4) = fVar50;
      lVar27 = lVar27 + 1;
    } while (lVar35 != lVar27);
  }
  if (local_c8->lightmode != false) {
    piVar10 = (this->super_Convolution).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar33 = (this->super_Convolution).weight_data.data;
        pAVar11 = (this->super_Convolution).weight_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          if (pvVar33 != (void *)0x0) {
            free(pvVar33);
          }
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_130->refcount + 4) = 0;
    *(undefined8 *)((long)&local_130->elemsize + 4) = 0;
    local_130->data = (void *)0x0;
    local_130->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}